

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O2

void set_max_size_cb(Fl_Button *param_1,void *v)

{
  Fl_Type *pFVar1;
  bool bVar2;
  int iVar3;
  Fl_Type **ppFVar4;
  
  if ((char *)v != "LOAD") {
    bVar2 = false;
    ppFVar4 = &Fl_Type::first;
    while (pFVar1 = *ppFVar4, pFVar1 != (Fl_Type *)0x0) {
      if (pFVar1->selected != '\0') {
        iVar3 = (*pFVar1->_vptr_Fl_Type[0x21])(pFVar1);
        if (iVar3 != 0) {
          current_widget[1].super_Fl_Type.next = *(Fl_Type **)&current_widget->o->w_;
          bVar2 = true;
        }
      }
      ppFVar4 = &pFVar1->next;
    }
    propagate_load(&the_panel->super_Fl_Group,"LOAD");
    if (bVar2) {
      set_modflag(1);
      return;
    }
  }
  return;
}

Assistant:

void set_max_size_cb(Fl_Button*, void* v) {
  if (v == LOAD) {
  } else {
    int mod = 0;
    for (Fl_Type *o = Fl_Type::first; o; o = o->next) {
      if (o->selected && o->is_window()) {
        Fl_Window_Type *win = (Fl_Window_Type*)current_widget;
        win->sr_max_w = win->o->w();
        win->sr_max_h = win->o->h();
        mod = 1;
      }
    }
    propagate_load(the_panel, LOAD);
    if (mod) set_modflag(1);
  }
}